

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# decode_traits.hpp
# Opt level: O1

bool __thiscall
jsoncons::typed_array_visitor<std::vector<unsigned_short,_std::allocator<unsigned_short>_>_>::
visit_typed_array(typed_array_visitor<std::vector<unsigned_short,_std::allocator<unsigned_short>_>_>
                  *this,span<const_unsigned_short,_18446744073709551615UL> *data,
                 semantic_tag param_2,ser_context *param_3,error_code *param_4)

{
  allocator_type local_29;
  void *local_28 [2];
  long local_18;
  
  std::vector<unsigned_short,std::allocator<unsigned_short>>::vector<unsigned_short_const*,void>
            ((vector<unsigned_short,std::allocator<unsigned_short>> *)local_28,data->data_,
             data->data_ + data->size_,&local_29);
  std::vector<unsigned_short,_std::allocator<unsigned_short>_>::_M_move_assign
            (this->v_,(vector<unsigned_short,std::allocator<unsigned_short>> *)local_28);
  if (local_28[0] != (void *)0x0) {
    operator_delete(local_28[0],local_18 - (long)local_28[0]);
  }
  return true;
}

Assistant:

JSONCONS_VISITOR_RETURN_TYPE visit_typed_array(const jsoncons::span<const value_type>& data,  
            semantic_tag,
            const ser_context&,
            std::error_code&) override
        {
            v_ = std::vector<value_type>(data.begin(),data.end());
            JSONCONS_VISITOR_RETURN;
        }